

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O3

void __thiscall
slang::parsing::anon_unknown_4::MetadataVisitor::handle
          (MetadataVisitor *this,HierarchyInstantiationSyntax *syntax)

{
  flat_hash_set<std::string_view> *arrays_;
  size_t *psVar1;
  uchar *puVar2;
  group_type_pointer pgVar3;
  size_type sVar4;
  value_type_pointer pbVar5;
  byte bVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  byte bVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  byte bVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  byte bVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  byte bVar22;
  size_t sVar23;
  char *pcVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  byte bVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  byte bVar40;
  int iVar41;
  uint uVar42;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *phVar43;
  uint64_t uVar44;
  size_t sVar45;
  SyntaxNode *node;
  size_t sVar46;
  ulong uVar47;
  long lVar48;
  size_type __rlen;
  ulong uVar49;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_00;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uchar uVar52;
  uchar uVar53;
  uchar uVar54;
  byte bVar55;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  byte bVar59;
  uchar uVar60;
  uchar uVar61;
  uchar uVar62;
  byte bVar63;
  uchar uVar64;
  uchar uVar65;
  uchar uVar66;
  byte bVar67;
  Token token;
  value_type *elements;
  size_t pos;
  string_view name;
  locator res;
  string_view local_b0;
  ulong local_a0;
  group_type_pointer local_98;
  uint64_t local_90;
  uchar local_88;
  uchar uStack_87;
  uchar uStack_86;
  byte bStack_85;
  uchar uStack_84;
  uchar uStack_83;
  uchar uStack_82;
  byte bStack_81;
  uchar uStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  byte bStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  byte bStack_79;
  size_t local_78;
  ulong local_70;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator local_48;
  
  local_b0 = Token::valueText(&syntax->type);
  if ((local_b0._M_len != 0) && ((syntax->type).kind == Identifier)) {
    sVar4 = (this->moduleDeclStack).
            super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            .len;
    if (sVar4 != 0) {
      this_00 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                (this->moduleDeclStack).
                super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                .data_;
      phVar43 = this_00 + sVar4 * 0x30;
      do {
        uVar44 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           (this_00,&local_b0);
        uVar47 = uVar44 >> ((byte)*this_00 & 0x3f);
        local_a0 = *(ulong *)(this_00 + 0x10);
        lVar48 = (uVar44 & 0xff) * 4;
        uVar52 = (&UNK_00461acc)[lVar48];
        uVar53 = (&UNK_00461acd)[lVar48];
        uVar54 = (&UNK_00461ace)[lVar48];
        bVar55 = (&UNK_00461acf)[lVar48];
        sVar23 = local_b0._M_len;
        pcVar24 = local_b0._M_str;
        local_98 = (group_type_pointer)(ulong)((uint)uVar44 & 7);
        uVar49 = 0;
        uVar56 = uVar52;
        uVar57 = uVar53;
        uVar58 = uVar54;
        bVar59 = bVar55;
        uVar60 = uVar52;
        uVar61 = uVar53;
        uVar62 = uVar54;
        bVar63 = bVar55;
        uVar64 = uVar52;
        uVar65 = uVar53;
        uVar66 = uVar54;
        bVar67 = bVar55;
        do {
          puVar2 = (uchar *)(local_a0 + uVar47 * 0x10);
          local_58 = *puVar2;
          uStack_57 = puVar2[1];
          uStack_56 = puVar2[2];
          bStack_55 = puVar2[3];
          uStack_54 = puVar2[4];
          uStack_53 = puVar2[5];
          uStack_52 = puVar2[6];
          bStack_51 = puVar2[7];
          uStack_50 = puVar2[8];
          uStack_4f = puVar2[9];
          uStack_4e = puVar2[10];
          bStack_4d = puVar2[0xb];
          uStack_4c = puVar2[0xc];
          uStack_4b = puVar2[0xd];
          uStack_4a = puVar2[0xe];
          bVar6 = puVar2[0xf];
          auVar50[0] = -(local_58 == uVar52);
          auVar50[1] = -(uStack_57 == uVar53);
          auVar50[2] = -(uStack_56 == uVar54);
          auVar50[3] = -(bStack_55 == bVar55);
          auVar50[4] = -(uStack_54 == uVar56);
          auVar50[5] = -(uStack_53 == uVar57);
          auVar50[6] = -(uStack_52 == uVar58);
          auVar50[7] = -(bStack_51 == bVar59);
          auVar50[8] = -(uStack_50 == uVar60);
          auVar50[9] = -(uStack_4f == uVar61);
          auVar50[10] = -(uStack_4e == uVar62);
          auVar50[0xb] = -(bStack_4d == bVar63);
          auVar50[0xc] = -(uStack_4c == uVar64);
          auVar50[0xd] = -(uStack_4b == uVar65);
          auVar50[0xe] = -(uStack_4a == uVar66);
          auVar50[0xf] = -(bVar6 == bVar67);
          uVar42 = (uint)(ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe);
          bStack_49 = bVar6;
          if (uVar42 != 0) {
            lVar48 = *(long *)(this_00 + 0x18) + uVar47 * 0xf0;
            local_88 = uVar52;
            uStack_87 = uVar53;
            uStack_86 = uVar54;
            bStack_85 = bVar55;
            uStack_84 = uVar56;
            uStack_83 = uVar57;
            uStack_82 = uVar58;
            bStack_81 = bVar59;
            uStack_80 = uVar60;
            uStack_7f = uVar61;
            uStack_7e = uVar62;
            bStack_7d = bVar63;
            uStack_7c = uVar64;
            uStack_7b = uVar65;
            uStack_7a = uVar66;
            bStack_79 = bVar67;
            do {
              iVar41 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> iVar41 & 1) == 0; iVar41 = iVar41 + 1) {
                }
              }
              if ((sVar23 == *(size_t *)(lVar48 + (ulong)(uint)(iVar41 << 4))) &&
                 ((sVar23 == 0 ||
                  (iVar41 = bcmp(pcVar24,*(void **)(lVar48 + 8 + (ulong)(uint)(iVar41 << 4)),sVar23)
                  , uVar52 = local_88, uVar53 = uStack_87, uVar54 = uStack_86, bVar55 = bStack_85,
                  uVar56 = uStack_84, uVar57 = uStack_83, uVar58 = uStack_82, bVar59 = bStack_81,
                  uVar60 = uStack_80, uVar61 = uStack_7f, uVar62 = uStack_7e, bVar63 = bStack_7d,
                  uVar64 = uStack_7c, uVar65 = uStack_7b, uVar66 = uStack_7a, bVar67 = bStack_79,
                  iVar41 == 0)))) goto LAB_00326261;
              uVar42 = uVar42 - 1 & uVar42;
            } while (uVar42 != 0);
          }
          if ((local_98[0x461ec].m[0].n & bVar6) == 0) break;
          lVar48 = uVar47 + uVar49;
          uVar49 = uVar49 + 1;
          uVar47 = lVar48 + 1U & *(ulong *)(this_00 + 8);
        } while (uVar49 <= *(ulong *)(this_00 + 8));
        this_00 = this_00 + 0x30;
      } while (this_00 != phVar43);
    }
    arrays_ = &(this->meta).globalInstances;
    local_90 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          arrays_,&local_b0);
    uVar47 = local_90 >>
             ((byte)(this->meta).globalInstances.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                    .arrays.groups_size_index & 0x3f);
    local_98 = (this->meta).globalInstances.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.groups_;
    lVar48 = (local_90 & 0xff) * 4;
    uVar52 = (&UNK_00461acc)[lVar48];
    uVar53 = (&UNK_00461acd)[lVar48];
    uVar54 = (&UNK_00461ace)[lVar48];
    bVar55 = (&UNK_00461acf)[lVar48];
    pbVar5 = (this->meta).globalInstances.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
             .arrays.elements_;
    sVar23 = local_b0._M_len;
    pcVar24 = local_b0._M_str;
    local_a0 = (ulong)((uint)local_90 & 7);
    local_78 = (this->meta).globalInstances.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.groups_size_mask;
    uVar49 = 0;
    uVar56 = uVar52;
    uVar57 = uVar53;
    uVar58 = uVar54;
    bVar59 = bVar55;
    uVar60 = uVar52;
    uVar61 = uVar53;
    uVar62 = uVar54;
    bVar63 = bVar55;
    uVar64 = uVar52;
    uVar65 = uVar53;
    uVar66 = uVar54;
    bVar67 = bVar55;
    local_70 = uVar47;
    do {
      pgVar3 = local_98 + uVar47;
      local_68 = pgVar3->m[0].n;
      uStack_67 = pgVar3->m[1].n;
      uStack_66 = pgVar3->m[2].n;
      bStack_65 = pgVar3->m[3].n;
      uStack_64 = pgVar3->m[4].n;
      uStack_63 = pgVar3->m[5].n;
      uStack_62 = pgVar3->m[6].n;
      bStack_61 = pgVar3->m[7].n;
      uStack_60 = pgVar3->m[8].n;
      uStack_5f = pgVar3->m[9].n;
      uStack_5e = pgVar3->m[10].n;
      bStack_5d = pgVar3->m[0xb].n;
      uStack_5c = pgVar3->m[0xc].n;
      uStack_5b = pgVar3->m[0xd].n;
      uStack_5a = pgVar3->m[0xe].n;
      bVar6 = pgVar3->m[0xf].n;
      auVar51[0] = -(local_68 == uVar52);
      auVar51[1] = -(uStack_67 == uVar53);
      auVar51[2] = -(uStack_66 == uVar54);
      auVar51[3] = -(bStack_65 == bVar55);
      auVar51[4] = -(uStack_64 == uVar56);
      auVar51[5] = -(uStack_63 == uVar57);
      auVar51[6] = -(uStack_62 == uVar58);
      auVar51[7] = -(bStack_61 == bVar59);
      auVar51[8] = -(uStack_60 == uVar60);
      auVar51[9] = -(uStack_5f == uVar61);
      auVar51[10] = -(uStack_5e == uVar62);
      auVar51[0xb] = -(bStack_5d == bVar63);
      auVar51[0xc] = -(uStack_5c == uVar64);
      auVar51[0xd] = -(uStack_5b == uVar65);
      auVar51[0xe] = -(uStack_5a == uVar66);
      auVar51[0xf] = -(bVar6 == bVar67);
      bStack_59 = bVar6;
      uVar25 = uVar52;
      uVar26 = uVar53;
      uVar27 = uVar54;
      bVar28 = bVar55;
      uVar29 = uVar56;
      uVar30 = uVar57;
      uVar31 = uVar58;
      bVar32 = bVar59;
      uVar33 = uVar60;
      uVar34 = uVar61;
      uVar35 = uVar62;
      bVar36 = bVar63;
      uVar37 = uVar64;
      uVar38 = uVar65;
      uVar39 = uVar66;
      bVar40 = bVar67;
      uVar7 = local_88;
      uVar8 = uStack_87;
      uVar9 = uStack_86;
      bVar10 = bStack_85;
      uVar11 = uStack_84;
      uVar12 = uStack_83;
      uVar13 = uStack_82;
      bVar14 = bStack_81;
      uVar15 = uStack_80;
      uVar16 = uStack_7f;
      uVar17 = uStack_7e;
      bVar18 = bStack_7d;
      uVar19 = uStack_7c;
      uVar20 = uStack_7b;
      uVar21 = uStack_7a;
      bVar22 = bStack_79;
      for (uVar42 = (uint)(ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe);
          bStack_79 = bVar40, uStack_7a = uVar39, uStack_7b = uVar38, uStack_7c = uVar37,
          bStack_7d = bVar36, uStack_7e = uVar35, uStack_7f = uVar34, uStack_80 = uVar33,
          bStack_81 = bVar32, uStack_82 = uVar31, uStack_83 = uVar30, uStack_84 = uVar29,
          bStack_85 = bVar28, uStack_86 = uVar27, uStack_87 = uVar26, local_88 = uVar25, uVar42 != 0
          ; uVar42 = uVar42 - 1 & uVar42) {
        iVar41 = 0;
        if (uVar42 != 0) {
          for (; (uVar42 >> iVar41 & 1) == 0; iVar41 = iVar41 + 1) {
          }
        }
        if ((sVar23 == *(size_t *)((long)&pbVar5[uVar47 * 0xf]._M_len + (ulong)(uint)(iVar41 << 4)))
           && ((sVar23 == 0 ||
               (iVar41 = bcmp(pcVar24,*(void **)((long)&pbVar5[uVar47 * 0xf]._M_str +
                                                (ulong)(uint)(iVar41 << 4)),sVar23),
               uVar52 = local_88, uVar53 = uStack_87, uVar54 = uStack_86, bVar55 = bStack_85,
               uVar56 = uStack_84, uVar57 = uStack_83, uVar58 = uStack_82, bVar59 = bStack_81,
               uVar60 = uStack_80, uVar61 = uStack_7f, uVar62 = uStack_7e, bVar63 = bStack_7d,
               uVar64 = uStack_7c, uVar65 = uStack_7b, uVar66 = uStack_7a, bVar67 = bStack_79,
               iVar41 == 0)))) goto LAB_00326261;
        uVar25 = local_88;
        uVar26 = uStack_87;
        uVar27 = uStack_86;
        bVar28 = bStack_85;
        uVar29 = uStack_84;
        uVar30 = uStack_83;
        uVar31 = uStack_82;
        bVar32 = bStack_81;
        uVar33 = uStack_80;
        uVar34 = uStack_7f;
        uVar35 = uStack_7e;
        bVar36 = bStack_7d;
        uVar37 = uStack_7c;
        uVar38 = uStack_7b;
        uVar39 = uStack_7a;
        bVar40 = bStack_79;
        uVar7 = local_88;
        uVar8 = uStack_87;
        uVar9 = uStack_86;
        bVar10 = bStack_85;
        uVar11 = uStack_84;
        uVar12 = uStack_83;
        uVar13 = uStack_82;
        bVar14 = bStack_81;
        uVar15 = uStack_80;
        uVar16 = uStack_7f;
        uVar17 = uStack_7e;
        bVar18 = bStack_7d;
        uVar19 = uStack_7c;
        uVar20 = uStack_7b;
        uVar21 = uStack_7a;
        bVar22 = bStack_79;
      }
      local_88 = uVar7;
      uStack_87 = uVar8;
      uStack_86 = uVar9;
      bStack_85 = bVar10;
      uStack_84 = uVar11;
      uStack_83 = uVar12;
      uStack_82 = uVar13;
      bStack_81 = bVar14;
      uStack_80 = uVar15;
      uStack_7f = uVar16;
      uStack_7e = uVar17;
      bStack_7d = bVar18;
      uStack_7c = uVar19;
      uStack_7b = uVar20;
      uStack_7a = uVar21;
      bStack_79 = bVar22;
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[local_a0] & bVar6) == 0) break;
      lVar48 = uVar47 + uVar49;
      uVar49 = uVar49 + 1;
      uVar47 = lVar48 + 1U & local_78;
    } while (uVar49 <= local_78);
    if ((this->meta).globalInstances.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.size <
        (this->meta).globalInstances.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)arrays_,(arrays_type *)arrays_,local_70,local_90,&local_b0);
      psVar1 = &(this->meta).globalInstances.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)arrays_,local_90,&local_b0);
    }
  }
LAB_00326261:
  sVar45 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
  if (sVar45 != 0) {
    uVar42 = 1;
    sVar45 = 0;
    do {
      node = slang::syntax::SyntaxNode::childNode((SyntaxNode *)syntax,sVar45);
      if (node == (SyntaxNode *)0x0) {
        token = slang::syntax::SyntaxNode::childToken((SyntaxNode *)syntax,sVar45);
        if (token.info != (Info *)0x0) {
          visitToken(this,token);
        }
      }
      else {
        slang::syntax::detail::
        visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::parsing::(anonymous_namespace)::MetadataVisitor>
                  (node,this);
      }
      sVar45 = (size_t)uVar42;
      sVar46 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
      uVar42 = uVar42 + 1;
    } while (sVar45 < sVar46);
  }
  return;
}

Assistant:

void handle(const HierarchyInstantiationSyntax& syntax) {
        std::string_view name = syntax.type.valueText();
        if (!name.empty() && syntax.type.kind == TokenKind::Identifier) {
            bool found = false;
            for (auto& set : moduleDeclStack) {
                if (set.find(name) != set.end()) {
                    found = true;
                    break;
                }
            }
            if (!found)
                meta.globalInstances.emplace(name);
        }
        visitDefault(syntax);
    }